

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O1

Vec_Int_t *
Gia_PolynFindOrder(Gia_Man_t *pGia,Vec_Int_t *vFadds,Vec_Int_t *vHadds,int fVerbose,int fVeryVerbose
                  )

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  Vec_Int_t *p;
  int *piVar7;
  void *__s;
  Vec_Int_t *pVVar8;
  long lVar9;
  Vec_Int_t *vNodes;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  uint local_44;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar7 = (int *)malloc(400);
  p->pArray = piVar7;
  iVar1 = pGia->nObjs;
  iVar17 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar17 = iVar1;
  }
  if (iVar17 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar17 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  pVVar8 = pGia->vCos;
  if (0 < pVVar8->nSize) {
    piVar7 = pVVar8->pArray;
    lVar11 = 0;
    do {
      iVar17 = piVar7[lVar11];
      if (((long)iVar17 < 0) || (pGia->nObjs <= iVar17)) goto LAB_00678509;
      uVar15 = iVar17 - (*(uint *)(pGia->pObjs + iVar17) & 0x1fffffff);
      if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) goto LAB_006784ea;
      *(undefined4 *)((long)__s + (ulong)uVar15 * 4) = 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar8->nSize);
  }
  if (pGia->vXors != (Vec_Int_t *)0x0) {
    piVar7 = pGia->vXors->pArray;
    if (piVar7 != (int *)0x0) {
      free(piVar7);
      pGia->vXors->pArray = (int *)0x0;
    }
    if (pGia->vXors != (Vec_Int_t *)0x0) {
      free(pGia->vXors);
      pGia->vXors = (Vec_Int_t *)0x0;
    }
  }
  pVVar8 = Gia_PolynCollectLastXor(pGia,fVerbose);
  pGia->vXors = pVVar8;
  printf("Collected %d topmost XORs\n",(ulong)(uint)pVVar8->nSize);
  pVVar8 = pGia->vXors;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      uVar15 = pVVar8->pArray[lVar11];
      lVar12 = (long)(int)uVar15;
      if ((lVar12 < 0) || (pGia->nObjs <= (int)uVar15)) goto LAB_00678509;
      if (iVar1 <= (int)uVar15) {
LAB_006784cb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s + lVar12 * 4) == 0) {
        __assert_fail("Vec_IntEntry(vMap, iAnd)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecOrder.c"
                      ,0x3e,
                      "Vec_Int_t *Gia_PolynFindOrder(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      pGVar18 = pGia->pObjs + lVar12;
      *(undefined4 *)((long)__s + lVar12 * 4) = 0;
      uVar6 = uVar15 - (*(uint *)pGVar18 & 0x1fffffff);
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
LAB_006784ea:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar6 * 4) = 1;
      uVar6 = uVar15 - (*(uint *)&pGVar18->field_0x4 & 0x1fffffff);
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) goto LAB_006784ea;
      *(undefined4 *)((long)__s + (ulong)uVar6 * 4) = 1;
      Vec_IntPush(p,uVar15 * 4 + 3);
      if (fVeryVerbose != 0) {
        printf("Recognizing %d => XXXOR(%d %d)\n",(ulong)uVar15,
               (ulong)(uVar15 - ((uint)*(undefined8 *)pGVar18 & 0x1fffffff)),
               (ulong)(uVar15 - ((uint)((ulong)*(undefined8 *)pGVar18 >> 0x20) & 0x1fffffff)));
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pGia->vXors;
    } while (lVar11 < pVVar8->nSize);
  }
  local_44 = 0;
  do {
    if (fVeryVerbose != 0) {
      printf("Iteration %d\n",(ulong)local_44);
    }
    bVar5 = false;
    do {
      uVar15 = vFadds->nSize;
      bVar4 = true;
      if (4 < (int)uVar15) {
        uVar16 = (ulong)uVar15 / 5;
        iVar17 = ((uint)((ulong)uVar15 * 0xcccccccd >> 0x20) & 0xfffffffc) - 2;
        lVar12 = uVar16 + 1;
        bVar4 = false;
        lVar11 = uVar16 * 5;
        do {
          lVar14 = lVar11 + -5;
          if (((long)vFadds->nSize <= lVar11 + -2) || ((long)vFadds->nSize <= lVar11 + -1))
          goto LAB_006784cb;
          piVar7 = vFadds->pArray;
          uVar15 = piVar7[lVar11 + -2];
          if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) goto LAB_006784cb;
          if (*(int *)((long)__s + (ulong)uVar15 * 4) != 0) {
            uVar6 = piVar7[lVar11 + -1];
            if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) goto LAB_006784cb;
            if (*(int *)((long)__s + (ulong)uVar6 * 4) != 0) {
              *(undefined4 *)((long)__s + (ulong)uVar15 * 4) = 0;
              *(undefined4 *)((long)__s + (ulong)uVar6 * 4) = 0;
              iVar2 = piVar7[lVar14];
              if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_006784ea;
              *(undefined4 *)((long)__s + (long)iVar2 * 4) = 1;
              iVar2 = piVar7[lVar11 + -4];
              if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_006784ea;
              *(undefined4 *)((long)__s + (long)iVar2 * 4) = 1;
              iVar2 = piVar7[lVar11 + -3];
              if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_006784ea;
              *(undefined4 *)((long)__s + (long)iVar2 * 4) = 1;
              Vec_IntPush(p,iVar17);
              if (fVeryVerbose == 0) {
                bVar5 = true;
                bVar4 = true;
              }
              else {
                lVar9 = (long)vFadds->nSize;
                if (((lVar9 <= lVar14) || (lVar9 <= lVar11 + -4)) || (lVar9 <= lVar11 + -3))
                goto LAB_006784cb;
                bVar5 = true;
                piVar7 = vFadds->pArray;
                printf("Recognizing (%d %d) => FA(%d %d %d)\n",(ulong)uVar15,(ulong)uVar6,
                       (ulong)(uint)piVar7[lVar14],(ulong)(uint)piVar7[lVar11 + -4],
                       (ulong)(uint)piVar7[lVar11 + -3]);
                bVar4 = true;
              }
            }
          }
          lVar12 = lVar12 + -1;
          iVar17 = iVar17 + -4;
          lVar11 = lVar14;
        } while (1 < lVar12);
        bVar4 = !bVar4;
      }
    } while (!bVar4);
    uVar15 = vHadds->nSize;
    if (1 < (int)uVar15) {
      lVar11 = (ulong)(uVar15 >> 1) + 1;
      iVar17 = (uVar15 >> 1) * 4 + -3;
      uVar16 = (ulong)(uVar15 & 0xfffffffe);
      do {
        if (((long)vHadds->nSize <= (long)(uVar16 - 2)) ||
           ((long)vHadds->nSize <= (long)(uVar16 - 1))) goto LAB_006784cb;
        uVar15 = vHadds->pArray[lVar11 * 2 + -4];
        if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) goto LAB_006784cb;
        if (*(int *)((long)__s + (ulong)uVar15 * 4) != 0) {
          uVar6 = vHadds->pArray[lVar11 * 2 + -3];
          uVar13 = (ulong)uVar6;
          if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) goto LAB_006784cb;
          if (*(int *)((long)__s + uVar13 * 4) != 0) {
            if (pGia->nObjs <= (int)uVar6) goto LAB_00678509;
            pGVar18 = pGia->pObjs;
            *(undefined4 *)((long)__s + (ulong)uVar15 * 4) = 0;
            *(undefined4 *)((long)__s + uVar13 * 4) = 0;
            uVar10 = uVar6 - (*(uint *)(pGVar18 + uVar13) & 0x1fffffff);
            if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_006784ea;
            pGVar18 = pGVar18 + uVar13;
            *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
            uVar10 = uVar6 - (*(uint *)&pGVar18->field_0x4 & 0x1fffffff);
            if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_006784ea;
            *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
            Vec_IntPush(p,iVar17);
            bVar5 = true;
            if (fVeryVerbose != 0) {
              printf("Recognizing (%d %d) => HA(%d %d)\n",(ulong)uVar15,(ulong)uVar6,
                     (ulong)(uVar6 - ((uint)*(undefined8 *)pGVar18 & 0x1fffffff)));
            }
          }
        }
        lVar11 = lVar11 + -1;
        iVar17 = iVar17 + -4;
        uVar16 = uVar16 - 2;
      } while (1 < lVar11);
    }
    local_44 = local_44 + 1;
  } while (bVar5);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar8->pArray = piVar7;
  if (0 < iVar1) {
    lVar11 = 0;
    do {
      if (*(int *)((long)__s + lVar11 * 4) != 0) {
        if (pGia->nObjs <= lVar11) {
LAB_00678509:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + lVar11) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + lVar11)) {
          Vec_IntPush(pVVar8,(int)lVar11);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar1);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  piVar7 = (int *)malloc(400);
  vNodes->pArray = piVar7;
  Gia_ManIncrementTravId(pGia);
  piVar7 = pVVar8->pArray;
  Gia_ManCollectAnds(pGia,piVar7,pVVar8->nSize,vNodes,(Vec_Int_t *)0x0);
  if (0 < vNodes->nSize) {
    piVar3 = vNodes->pArray;
    lVar11 = 0;
    do {
      piVar3[lVar11] = piVar3[lVar11] << 2;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  uVar15 = p->nSize;
  if (1 < (int)uVar15) {
    piVar7 = p->pArray;
    uVar16 = 0;
    uVar6 = uVar15;
    do {
      uVar6 = uVar6 - 1;
      iVar1 = piVar7[uVar16];
      piVar7[uVar16] = piVar7[(int)uVar6];
      piVar7[(int)uVar6] = iVar1;
      uVar16 = uVar16 + 1;
    } while (uVar15 >> 1 != uVar16);
  }
  if (0 < (int)uVar15) {
    piVar7 = p->pArray;
    uVar16 = 0;
    do {
      Vec_IntPush(vNodes,piVar7[uVar16]);
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return vNodes;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_PolynFindOrder( Gia_Man_t * pGia, Vec_Int_t * vFadds, Vec_Int_t * vHadds, int fVerbose, int fVeryVerbose )
{
    int fDumpLeftOver = 0;
    int i, iXor, iMaj, iAnd, Entry, Iter, fFound, fFoundAll = 1;
    Vec_Int_t * vRecord = Vec_IntAlloc( 100 ), * vLeft, * vRecord2;
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCoDriverId( pGia, iAnd, i )
        Vec_IntWriteEntry( vMap, iAnd, 1 );

    // collect the last XOR
    Vec_IntFreeP( &pGia->vXors );
    pGia->vXors = Gia_PolynCollectLastXor( pGia, fVerbose );
    printf( "Collected %d topmost XORs\n", Vec_IntSize(pGia->vXors) );
    //Vec_IntPrint( p->vXors );
    Vec_IntForEachEntry( pGia->vXors, iAnd, i )
    {
        Gia_Obj_t * pAnd = Gia_ManObj( pGia, iAnd );
        assert( Vec_IntEntry(vMap, iAnd) );
        Vec_IntWriteEntry( vMap, iAnd, 0 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
        Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 3) );
        if ( fVeryVerbose )
            printf( "Recognizing %d => XXXOR(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
    }

    // detect FAs and HAs
    for ( Iter = 0; fFoundAll; Iter++ )
    {
        if ( fVeryVerbose )
            printf( "Iteration %d\n", Iter );

        // check if we can extract FADDs
        fFoundAll = 0;
        do {
            fFound = 0;
            for ( i = Vec_IntSize(vFadds)/5 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vFadds, 5*i+3);
                iMaj = Vec_IntEntry(vFadds, 5*i+4);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+0), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+1), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+2), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 2) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => FA(%d %d %d)\n", iXor, iMaj, Vec_IntEntry(vFadds, 5*i+0), Vec_IntEntry(vFadds, 5*i+1), Vec_IntEntry(vFadds, 5*i+2)  );
                }
            }
        } while ( fFound );
        // check if we can extract HADDs
        do {
            fFound = 0; 
            for ( i = Vec_IntSize(vHadds)/2 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vHadds, 2*i+0);
                iMaj = Vec_IntEntry(vHadds, 2*i+1);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Gia_Obj_t * pAnd = Gia_ManObj( pGia, iMaj );
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iMaj), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iMaj), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 1) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => HA(%d %d)\n", iXor, iMaj, Gia_ObjFaninId0(pAnd, iMaj), Gia_ObjFaninId1(pAnd, iMaj) );
                }
            }
            break; // only one iter!
        } while ( fFound );
        if ( fFoundAll )
            continue;
/*
        // find the last one
        Vec_IntForEachEntryReverse( vMap, Entry, iAnd )
            if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, iAnd)) )//&& Vec_IntFind(vFadds, iAnd) == -1 )//&& Vec_IntFind(vHadds, iAnd) == -1 )
            {
                Gia_Obj_t * pFan0, * pFan1, * pAnd = Gia_ManObj( pGia, iAnd );
                if ( !Gia_ObjRecognizeExor(pAnd, &pFan0, &pFan1) )
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                }
                else
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan0), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan1), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId0(pAnd, iAnd), 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId1(pAnd, iAnd), 0) );
                    printf( "Recognizing %d => XOR(%d %d)\n", iAnd, Gia_ObjId(pGia, pFan0), Gia_ObjId(pGia, pFan1) );
                }
                fFoundAll = 1;
                if ( fVeryVerbose )
                    printf( "Recognizing %d => AND(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
                break;
            }
*/
    }
    //Vec_IntPrint( vMap );

    // collect remaining ones
    vLeft = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vMap, Entry, i )
        if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, i)) )
            Vec_IntPush( vLeft, i );
    Vec_IntFree( vMap );

    // collect them in the topo order
    vRecord2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( pGia );
    Gia_ManCollectAnds( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), vRecord2, NULL );
    Vec_IntForEachEntry( vRecord2, iAnd, i )
        Vec_IntWriteEntry( vRecord2, i, Abc_Var2Lit2(iAnd, 0) );

    // dump remaining nodes as an AIG
    if ( fDumpLeftOver )
    {        
        Gia_Man_t * pNew;
        pNew = Gia_ManDupAndCones( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), 0 );
        Gia_AigerWrite( pNew, "leftover.aig", 0, 0, 0 );
        printf( "Leftover AIG with %d nodes is dumped into file \"%s\".\n", Gia_ManAndNum(pNew), "leftover.aig" );
        Gia_ManStop( pNew );
    }
    Vec_IntFree( vLeft );

    Vec_IntReverseOrder( vRecord );
    Vec_IntAppend( vRecord2, vRecord );
    Vec_IntFree( vRecord );
    return vRecord2;
}